

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_colorized_console.cpp
# Opt level: O0

bool crnlib::colorized_console::console_output_func
               (eConsoleMessageType type,char *pMsg,void *param_3)

{
  bool bVar1;
  undefined8 in_RSI;
  int in_EDI;
  
  bVar1 = console::get_output_disabled();
  if (!bVar1) {
    bVar1 = console::get_prefixes();
    if ((bVar1) && (bVar1 = console::get_at_beginning_of_line(), bVar1)) {
      if (in_EDI == 0) {
        printf("Debug: %s",in_RSI);
      }
      else if (in_EDI == 5) {
        printf("Warning: %s",in_RSI);
      }
      else if (in_EDI == 6) {
        printf("Error: %s",in_RSI);
      }
      else {
        printf("%s",in_RSI);
      }
    }
    else {
      printf("%s",in_RSI);
    }
    bVar1 = console::get_crlf();
    if (bVar1) {
      printf("\n");
    }
  }
  return true;
}

Assistant:

bool colorized_console::console_output_func(eConsoleMessageType type, const char* pMsg, void*) {
  if (console::get_output_disabled())
    return true;

  if ((console::get_prefixes()) && (console::get_at_beginning_of_line())) {
    switch (type) {
      case cDebugConsoleMessage:
        printf("Debug: %s", pMsg);
        break;
      case cWarningConsoleMessage:
        printf("Warning: %s", pMsg);
        break;
      case cErrorConsoleMessage:
        printf("Error: %s", pMsg);
        break;
      default:
        printf("%s", pMsg);
        break;
    }
  } else {
    printf("%s", pMsg);
  }

  if (console::get_crlf())
    printf("\n");

  return true;
}